

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodePolygonalFaces(ObjEncoder *this)

{
  bool bVar1;
  ValueType VVar2;
  PointIndex vert_index;
  map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  *this_00;
  ObjEncoder *this_01;
  pointer ppVar3;
  EncoderBuffer *data;
  mapped_type *data_size;
  ObjEncoder *in_RDI;
  PointIndex pi;
  AttributeValueIndex position_index;
  AttributeValueIndex first_position_index;
  FaceIndex fi;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> corner_table;
  PolygonEdges polygon_edges;
  vector<bool,_std::allocator<bool>_> triangle_visited;
  Mesh *in_stack_fffffffffffffee8;
  EncoderBuffer *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  FaceIndex in_stack_ffffffffffffff00;
  AttributeValueIndex in_stack_ffffffffffffff04;
  size_type in_stack_ffffffffffffff08;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  undefined1 local_a5;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_a4;
  _Base_ptr local_a0;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_94;
  uint local_90;
  uint local_8c;
  ValueType local_88;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_84 [5];
  PolygonEdges *in_stack_ffffffffffffff90;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff98;
  CornerTable *in_stack_ffffffffffffffa0;
  ObjEncoder *in_stack_ffffffffffffffa8;
  FaceIndex in_stack_ffffffffffffffb4;
  
  VVar2 = Mesh::num_faces((Mesh *)0x1248c5);
  this_00 = (map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
             *)(ulong)VVar2;
  std::allocator<bool>::allocator((allocator<bool> *)0x1248e6);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (bool *)CONCAT44(in_stack_ffffffffffffff04.value_,in_stack_ffffffffffffff00.value_),
             (allocator_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  std::allocator<bool>::~allocator((allocator<bool> *)0x124914);
  std::
  map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  ::map((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
         *)0x124921);
  CreateCornerTableFromPositionAttribute(in_stack_fffffffffffffee8);
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_84,0);
  while( true ) {
    vert_index.value_ = Mesh::num_faces((Mesh *)0x12495a);
    local_88 = vert_index.value_;
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_84,&local_88);
    if (!bVar1) break;
    local_8c = local_84[0].value_;
    EncodeFaceAttributes
              ((ObjEncoder *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               in_stack_ffffffffffffff00);
    std::
    map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
    ::clear((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
             *)0x1249c1);
    local_90 = local_84[0].value_;
    this_01 = (ObjEncoder *)
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator*((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                        in_stack_fffffffffffffef0);
    FindOriginalFaceEdges
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar1 = std::
            map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
            ::empty((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                     *)0x124a18);
    if (!bVar1) {
      local_a0 = (_Base_ptr)
                 std::
                 map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                 ::begin((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                          *)in_stack_fffffffffffffee8);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                             *)0x124aa4);
      local_a4.value_ = (ppVar3->first).value_;
      local_94.value_ = local_a4.value_;
      data = buffer(in_RDI);
      local_a5 = 0x66;
      EncoderBuffer::Encode<char>((EncoderBuffer *)this_01,(char *)data);
      do {
        data_size = std::
                    map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                    ::operator[](this_00,(key_type *)in_RDI);
        local_b0 = data_size->value_;
        local_ac = local_b0;
        EncodeFaceCorner(this_01,vert_index);
        in_stack_ffffffffffffff04 =
             PointAttribute::mapped_index
                       ((PointAttribute *)in_stack_fffffffffffffee8,(uint)in_stack_fffffffffffffef0)
        ;
        local_b8.value_ = in_stack_ffffffffffffff04.value_;
        in_stack_ffffffffffffff00.value_ =
             IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_b8);
        local_b4 = in_stack_ffffffffffffff00.value_;
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                  (&local_a4,&local_b4);
        in_stack_fffffffffffffeff =
             IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator!=
                       (&local_a4,&local_94);
      } while ((bool)in_stack_fffffffffffffeff);
      in_stack_fffffffffffffef0 = buffer(in_RDI);
      EncoderBuffer::Encode((EncoderBuffer *)this_01,data,(size_t)data_size);
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_84);
  }
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_ffffffffffffff04.value_,in_stack_ffffffffffffff00.value_));
  std::
  map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  ::~map((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
          *)0x124bee);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x124bfb)
  ;
  return true;
}

Assistant:

bool ObjEncoder::EncodePolygonalFaces() {
  // TODO(vytyaz): This could be a much smaller set of visited face indices.
  std::vector<bool> triangle_visited(in_mesh_->num_faces(), false);
  PolygonEdges polygon_edges;
  std::unique_ptr<CornerTable> corner_table =
      CreateCornerTableFromPositionAttribute(in_mesh_);
  for (FaceIndex fi(0); fi < in_mesh_->num_faces(); ++fi) {
    EncodeFaceAttributes(fi);
    // Reconstruct polygon from the added edges attribute if available.
    polygon_edges.clear();
    FindOriginalFaceEdges(fi, *corner_table, &triangle_visited, &polygon_edges);

    // Polygon edges could be empty if this triangle has been visited as part
    // of a polygon discovery that started from an earler face.
    if (polygon_edges.empty()) {
      continue;
    }

    // Traverse a polygon by following its edges. The starting point is not
    // guaranteed to be the same as in the original polygon. It is
    // deterministic, however, and defined by std::map behavior.
    const AttributeValueIndex first_position_index =
        polygon_edges.begin()->first;
    AttributeValueIndex position_index = first_position_index;
    buffer()->Encode('f');
    do {
      // Get the next polygon point index by following polygon edge.
      const PointIndex pi = polygon_edges[position_index];
      EncodeFaceCorner(pi);
      position_index = pos_att_->mapped_index(pi).value();
    } while (position_index != first_position_index);
    buffer()->Encode("\n", 1);
  }
  return true;
}